

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

void OnPollPreparePfn(stTimeoutItem_t *ap,epoll_event *e,stTimeoutItemLink_t *active)

{
  stTimeoutItem_t *ap_00;
  stTimeoutItem_t *psVar1;
  stTimeoutItemLink_t *psVar2;
  
  *(ushort *)((long)&(ap[1].pPrev)->pPrev + 6) = (ushort)e->events & 0x15d;
  ap_00 = ap[1].pNext;
  *(int *)&ap_00[1].pfnPrepare = *(int *)&ap_00[1].pfnPrepare + 1;
  if ((int)ap_00[1].ullExpireTime == 0) {
    *(undefined4 *)&ap_00[1].ullExpireTime = 1;
    RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(ap_00);
    if (ap_00->pLink == (stTimeoutItemLink_t *)0x0) {
      psVar1 = active->tail;
      psVar2 = (stTimeoutItemLink_t *)&psVar1->pNext;
      if (psVar1 == (stTimeoutItem_t *)0x0) {
        psVar2 = active;
      }
      psVar2->head = ap_00;
      active->tail = ap_00;
      ap_00->pPrev = psVar1;
      ap_00->pNext = (stTimeoutItem_t *)0x0;
      ap_00->pLink = active;
    }
  }
  return;
}

Assistant:

void OnPollPreparePfn( stTimeoutItem_t * ap,struct epoll_event &e,stTimeoutItemLink_t *active )
{
	stPollItem_t *lp = (stPollItem_t *)ap;
	lp->pSelf->revents = EpollEvent2Poll( e.events );


	stPoll_t *pPoll = lp->pPoll;
	pPoll->iRaiseCnt++;

	if( !pPoll->iAllEventDetach )
	{
		pPoll->iAllEventDetach = 1;

		RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( pPoll );

		AddTail( active,pPoll );

	}
}